

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O1

SRC_STATE *
src_callback_new(src_callback_t func,int converter_type,int channels,int *error,void *cb_data)

{
  SRC_STATE *pSVar1;
  
  if (func == (src_callback_t)0x0) {
    if (error != (int *)0x0) {
      *error = 0x11;
    }
  }
  else {
    if (error != (int *)0x0) {
      *error = 0;
    }
    pSVar1 = src_new(converter_type,channels,error);
    if (pSVar1 != (SRC_STATE *)0x0) {
      (*pSVar1->vt->reset)(pSVar1);
      pSVar1->last_ratio = 0.0;
      pSVar1->last_position = 0.0;
      pSVar1->error = SRC_ERR_NO_ERROR;
      pSVar1->saved_frames = 0;
      pSVar1->saved_data = (float *)0x0;
      pSVar1->mode = SRC_MODE_CALLBACK;
      pSVar1->callback_func = func;
      pSVar1->user_callback_data = cb_data;
      return pSVar1;
    }
  }
  return (SRC_STATE *)0x0;
}

Assistant:

SRC_STATE*
src_callback_new (src_callback_t func, int converter_type, int channels, int *error, void* cb_data)
{	SRC_STATE	*state ;

	if (func == NULL)
	{	if (error)
			*error = SRC_ERR_BAD_CALLBACK ;
		return NULL ;
		} ;

	if (error != NULL)
		*error = 0 ;

	if ((state = src_new (converter_type, channels, error)) == NULL)
		return NULL ;

	src_reset (state) ;

	state->mode = SRC_MODE_CALLBACK ;
	state->callback_func = func ;
	state->user_callback_data = cb_data ;

	return state ;
}